

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

void __thiscall Color::clamp(Color *this,int *r,int *g,int *b)

{
  if (0xff < *r) {
    *r = 0xff;
  }
  if (*r < 0) {
    *r = 0;
  }
  if (0xff < *g) {
    *g = 0xff;
  }
  if (*g < 0) {
    *g = 0;
  }
  if (0xff < *b) {
    *b = 0xff;
  }
  if (-1 < *b) {
    return;
  }
  *b = 0;
  return;
}

Assistant:

void Color::clamp(int& r, int& g, int& b) {
    if(r > 255) {
        r = 255;
    }
    if(r < 0){
        r=0;
    }
    if(g > 255){
        g=255;
    }
    if(g < 0){
        g=0;
    }
    if(b > 255){
        b=255;
    }
    if(b<0){
        b=0;
    }
}